

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cArrayOfArraysTests.cpp
# Opt level: O0

void __thiscall
glcts::ArraysOfArrays::ExpressionsDynamicIndexing1<glcts::ArraysOfArrays::Interface::ES>::
test_shader_compilation
          (ExpressionsDynamicIndexing1<glcts::ArraysOfArrays::Interface::ES> *this,
          TestShaderType tested_shader_type)

{
  TestError *pTVar1;
  string *local_1d0;
  size_t *local_148;
  string *fs;
  string *gs;
  string *tes;
  string *tcs;
  string *vs;
  string *cs;
  size_t read_index;
  size_t write_index;
  string shader_source;
  string local_d8 [8];
  string expressions [4];
  allocator<char> local_39;
  string local_38 [8];
  string expression_type_declarations;
  TestShaderType tested_shader_type_local;
  ExpressionsDynamicIndexing1<glcts::ArraysOfArrays::Interface::ES> *this_local;
  
  expression_type_declarations.field_2._12_4_ = tested_shader_type;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_38,"uniform int a;\nconst int b = 0;\nint c = 0;\nfloat x[2][2];\n",&local_39);
  std::allocator<char>::~allocator(&local_39);
  shader_source.field_2._M_local_buf[0xb] = '\x01';
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_d8,"a",(allocator<char> *)(shader_source.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(expressions[0].field_2._M_local_buf + 8),"b",
             (allocator<char> *)(shader_source.field_2._M_local_buf + 0xe));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(expressions[1].field_2._M_local_buf + 8),"c",
             (allocator<char> *)(shader_source.field_2._M_local_buf + 0xd));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(expressions[2].field_2._M_local_buf + 8),"0 + 1",
             (allocator<char> *)(shader_source.field_2._M_local_buf + 0xc));
  shader_source.field_2._M_local_buf[0xb] = '\0';
  std::allocator<char>::~allocator((allocator<char> *)(shader_source.field_2._M_local_buf + 0xc));
  std::allocator<char>::~allocator((allocator<char> *)(shader_source.field_2._M_local_buf + 0xd));
  std::allocator<char>::~allocator((allocator<char> *)(shader_source.field_2._M_local_buf + 0xe));
  std::allocator<char>::~allocator((allocator<char> *)(shader_source.field_2._M_local_buf + 0xf));
  std::__cxx11::string::string((string *)&write_index);
  for (read_index = 0; read_index < 4; read_index = read_index + 1) {
    for (cs = (string *)0x0; cs < (string *)&DAT_00000004; cs = (string *)&cs->field_0x1) {
      std::__cxx11::string::operator=((string *)&write_index,local_38);
      std::__cxx11::string::operator+=((string *)&write_index,(string *)shader_start_abi_cxx11_);
      std::__cxx11::string::operator+=((string *)&write_index,"    x[");
      std::__cxx11::string::operator+=
                ((string *)&write_index,
                 (string *)(expressions[read_index - 1].field_2._M_local_buf + 8));
      std::__cxx11::string::operator+=((string *)&write_index,"][");
      std::__cxx11::string::operator+=
                ((string *)&write_index,
                 (string *)
                 (expressions[(long)&cs[-1].field_2._M_allocated_capacity + 0xf].field_2.
                  _M_local_buf + 8));
      std::__cxx11::string::operator+=((string *)&write_index,"] = 1.0;\n\n");
      switch(expression_type_declarations.field_2._12_4_) {
      case 0:
        break;
      case 1:
        std::__cxx11::string::operator+=((string *)&write_index,"\n\tgl_Position = vec4(0.0);\n");
        break;
      case 2:
        break;
      case 3:
        std::__cxx11::string::operator+=((string *)&write_index,(string *)emit_quad_abi_cxx11_);
        break;
      case 4:
        std::__cxx11::string::operator+=((string *)&write_index,(string *)set_tesseation_abi_cxx11_)
        ;
        break;
      case 5:
        break;
      default:
        pTVar1 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar1,"Unrecognized shader type.",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                   ,0xd1b);
        __cxa_throw(pTVar1,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
      std::__cxx11::string::operator+=((string *)&write_index,(string *)shader_end_abi_cxx11_);
      tcs = (string *)default_vertex_shader_source_abi_cxx11_;
      local_148 = (size_t *)default_fragment_shader_source_abi_cxx11_;
      switch(expression_type_declarations.field_2._12_4_) {
      case 0:
        local_148 = &write_index;
        break;
      case 1:
        tcs = (string *)&write_index;
        break;
      case 2:
        tcs = (string *)empty_string_abi_cxx11_;
        local_148 = (size_t *)empty_string_abi_cxx11_;
        break;
      case 3:
        break;
      case 4:
        break;
      case 5:
        break;
      default:
        pTVar1 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar1,"Invalid enum",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                   ,0xd1e);
        __cxa_throw(pTVar1,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
      (*(this->super_TestCaseBase<glcts::ArraysOfArrays::Interface::ES>).super_TestCase.
        super_TestNode._vptr_TestNode[9])(this,tcs,local_148,1,0);
    }
  }
  std::__cxx11::string::~string((string *)&write_index);
  local_1d0 = (string *)(expressions[3].field_2._M_local_buf + 8);
  do {
    local_1d0 = local_1d0 + -0x20;
    std::__cxx11::string::~string(local_1d0);
  } while (local_1d0 != local_d8);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void ExpressionsDynamicIndexing1<API>::test_shader_compilation(
	typename TestCaseBase<API>::TestShaderType tested_shader_type)
{
	std::string expression_type_declarations = "uniform int a;\n"
											   "const int b = 0;\n"
											   "int c = 0;\n"
											   "float x[2][2];\n";

	std::string expressions[] = { "a", "b", "c", "0 + 1" };
	std::string shader_source;

	for (size_t write_index = 0; write_index < sizeof(expressions) / sizeof(expressions[0]); write_index++)
	{
		for (size_t read_index = 0; read_index < sizeof(expressions) / sizeof(expressions[0]); read_index++)
		{
			shader_source = expression_type_declarations;
			shader_source += shader_start;
			shader_source += "    x[";
			shader_source += expressions[write_index];
			shader_source += "][";
			shader_source += expressions[read_index];
			shader_source += "] = 1.0;\n\n";

			/* End main */
			DEFAULT_MAIN_ENDING(tested_shader_type, shader_source);

			/* Execute test */
			EXECUTE_POSITIVE_TEST(tested_shader_type, shader_source, true, false);
		} /* for (int read_index = 0; ...) */
	}	 /* for (int write_index = 0; ...) */
}